

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O3

TProb Cipher::calcScore(TParameters *params,TFreqMap *freqMap,
                       vector<int,_std::allocator<int>_> *plain,
                       vector<float,_std::allocator<float>_> *memo)

{
  unordered_map<int,_float,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_float>_>_>
  *this;
  pointer piVar1;
  float fVar2;
  char cVar3;
  long lVar4;
  const_iterator cVar5;
  TProb *pTVar6;
  TFreqMap *pTVar7;
  pointer pfVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  __hashtable *__h;
  float fVar15;
  array<int,_28UL> letCount;
  uint local_d4;
  TFreqMap *local_d0;
  float local_c4;
  vector<float,_std::allocator<float>_> *local_c0;
  float local_b4;
  TParameters *local_b0;
  int local_a8 [30];
  
  piVar1 = (plain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar12 = (ulong)((long)(plain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar1) >> 2;
  local_a8[0x18] = 0;
  local_a8[0x19] = 0;
  local_a8[0x1a] = 0;
  local_a8[0x1b] = 0;
  local_a8[0x14] = 0;
  local_a8[0x15] = 0;
  local_a8[0x16] = 0;
  local_a8[0x17] = 0;
  local_a8[0x10] = 0;
  local_a8[0x11] = 0;
  local_a8[0x12] = 0;
  local_a8[0x13] = 0;
  local_a8[0xc] = 0;
  local_a8[0xd] = 0;
  local_a8[0xe] = 0;
  local_a8[0xf] = 0;
  local_a8[8] = 0;
  local_a8[9] = 0;
  local_a8[10] = 0;
  local_a8[0xb] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_c4 = 0.0;
  fVar15 = 0.0;
  uVar11 = (uint)uVar12;
  if (0 < (int)uVar11) {
    uVar9 = 0;
    iVar14 = 0;
    do {
      uVar10 = (ulong)(uint)piVar1[uVar9];
      if (uVar10 < 0x1c) {
        local_a8[uVar10] = local_a8[uVar10] + 1;
        iVar14 = iVar14 + 1;
      }
      uVar9 = uVar9 + 1;
    } while ((uVar11 & 0x7fffffff) != uVar9);
    fVar15 = (float)iVar14;
  }
  this = &freqMap->prob;
  lVar4 = 0;
  do {
    fVar2 = *(float *)((long)&(anonymous_namespace)::kEnglishLetterWithSpacesFreq + lVar4) * 0.01 -
            (float)*(int *)((long)local_a8 + lVar4) / fVar15;
    local_c4 = local_c4 + fVar2 * fVar2;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x70);
  local_c4 = local_c4 / 28.0;
  local_d0 = freqMap;
  local_c0 = memo;
  if (local_c4 < 0.0) {
    local_c4 = sqrtf(local_c4);
  }
  else {
    local_c4 = SQRT(local_c4);
  }
  uVar13 = local_d0->len;
  cVar3 = (char)uVar13;
  local_d4 = 0;
  if ((long)(int)uVar13 < 1) {
    uVar13 = 0;
  }
  else {
    uVar9 = 0;
    uVar10 = 0;
    if (0 < (int)uVar11) {
      uVar10 = uVar12 & 0xffffffff;
    }
    local_d4 = 0;
    do {
      if (uVar10 == uVar9) {
        return -INFINITY;
      }
      local_d4 = local_d4 * 0x20 +
                 (plain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar9];
      uVar9 = uVar9 + 1;
    } while ((long)(int)uVar13 != uVar9);
  }
  pfVar8 = (local_c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  fVar15 = pfVar8[(long)(int)uVar13 + -1];
  local_b0 = params;
  if (0.5 < fVar15) {
    cVar5 = std::
            _Hashtable<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this->_M_h,(key_type_conflict *)&local_d4);
    if (cVar5.super__Node_iterator_base<std::pair<const_int,_float>,_false>._M_cur ==
        (__node_type *)0x0) {
      pTVar6 = &local_d0->pmin;
    }
    else {
      cVar5 = std::
              _Hashtable<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this->_M_h,(key_type_conflict *)&local_d4);
      if (cVar5.super__Node_iterator_base<std::pair<const_int,_float>,_false>._M_cur ==
          (__node_type *)0x0) {
LAB_001274e4:
        std::__throw_out_of_range("_Map_base::at");
      }
      pTVar6 = (TProb *)((long)cVar5.super__Node_iterator_base<std::pair<const_int,_float>,_false>.
                               _M_cur + 0xc);
    }
    fVar15 = *pTVar6;
    pfVar8 = (local_c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pfVar8[(long)(int)uVar13 + -1] = fVar15;
  }
  local_b4 = fVar15 + 0.0;
  local_d0 = (TFreqMap *)&local_d0->pmin;
  uVar12 = (ulong)uVar13;
  do {
    local_d4 = (local_d4 & ~(-1 << (cVar3 * '\x05' - 5U & 0x1f))) * 0x20 +
               (plain->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar12];
    fVar15 = pfVar8[uVar12];
    if (0.5 < fVar15) {
      cVar5 = std::
              _Hashtable<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this->_M_h,(key_type_conflict *)&local_d4);
      pTVar7 = local_d0;
      if (cVar5.super__Node_iterator_base<std::pair<const_int,_float>,_false>._M_cur !=
          (__node_type *)0x0) {
        cVar5 = std::
                _Hashtable<int,_std::pair<const_int,_float>,_std::allocator<std::pair<const_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&this->_M_h,(key_type_conflict *)&local_d4);
        if (cVar5.super__Node_iterator_base<std::pair<const_int,_float>,_false>._M_cur ==
            (__node_type *)0x0) goto LAB_001274e4;
        pTVar7 = (TFreqMap *)
                 ((long)cVar5.super__Node_iterator_base<std::pair<const_int,_float>,_false>._M_cur +
                 0xc);
      }
      fVar15 = (float)pTVar7->len;
      pfVar8 = (local_c0->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar8[uVar12] = fVar15;
    }
    local_b4 = local_b4 + fVar15;
    uVar12 = uVar12 + 1;
    if ((int)uVar11 <= (int)uVar12) {
      return local_b4 / (float)(int)uVar11 - local_c4 * local_b0->wEnglishFreq;
    }
  } while( true );
}

Assistant:

TProb calcScore(
            const TParameters & params,
            const TFreqMap & freqMap,
            const std::vector<TLetter> & plain,
                  std::vector<TProb> & memo) {
        TProb res = 0.0;

        const int n = plain.size();
        const auto & len  = freqMap.len;
        const auto & prob = freqMap.prob;

        int nlet = 0;
        std::array<int, 28> letCount;
        letCount.fill(0);
        for (int i = 0; i < n; ++i) {
            if (plain[i] >= 0 && plain[i] <= 27) {
                ++letCount[plain[i]];
                ++nlet;
            }
        }

        float letFreqCost = 0.0;
        {
            auto & freq = kEnglishLetterWithSpacesFreq;
            for (int i = 0; i <= 27; ++i) {
                float curf = 0.01*freq[i] - ((float)(letCount[i]))/((float)(nlet));
                letFreqCost += curf*curf;
            }
        }

        letFreqCost /= 28.0;
        letFreqCost = sqrt(letFreqCost);

        int i1 = 0;
        int k = len;
        TCode curc = 0;
        TCode mask = (1 << 5*(len-1)) - 1;

        while (k > 0) {
            if (i1 >= n) return -1e100;
            auto c = plain[i1++];
            curc <<= 5;
            curc += c;
            --k;
        }

        if (memo[i1 - 1] > 0.5) {
            memo[i1 - 1] = prob.find(curc) == prob.end() ? freqMap.pmin : prob.at(curc);
        }
        res += memo[i1 - 1];

        while (true) {
            curc &= mask;

            auto c = plain[i1++];
            curc <<= 5;
            curc += c;

            if (memo[i1 - 1] > 0.5) {
                memo[i1 - 1] = prob.find(curc) == prob.end() ? freqMap.pmin : prob.at(curc);
            }
            res += memo[i1 - 1];

            if (i1 >= n) break;
        }

        return res/n - params.wEnglishFreq*letFreqCost;
    }